

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::Finalize(PClassActor *this,FStateDefinitions *statedef)

{
  AActor *defaults_00;
  CRecoverableError *anon_var_0;
  AActor *defaults;
  FStateDefinitions *statedef_local;
  PClassActor *this_local;
  
  defaults_00 = (AActor *)(this->super_PClass).Defaults;
  FStateDefinitions::FinishStates(statedef,this,defaults_00);
  FStateDefinitions::InstallStates(statedef,this,defaults_00);
  FStateDefinitions::MakeStateDefines(statedef,(PClassActor *)0x0);
  return;
}

Assistant:

void PClassActor::Finalize(FStateDefinitions &statedef)
{
	AActor *defaults = (AActor*)Defaults;

	try
	{
		statedef.FinishStates(this, defaults);
	}
	catch (CRecoverableError &)
	{
		statedef.MakeStateDefines(NULL);
		throw;
	}
	statedef.InstallStates(this, defaults);
	statedef.MakeStateDefines(NULL);
}